

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O0

int dump(Options *opts,string *name)

{
  size_t sVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  uchar *puVar5;
  size_type sVar6;
  istream *piVar7;
  pointer pvVar8;
  tm *__tp;
  string *in_RSI;
  long in_RDI;
  ImageStructureHeader IVar9;
  TimeStampHeader TVar10;
  timespec tVar11;
  NOAALRITHeader NVar12;
  DCSFileNameHeader h_10;
  RiceCompressionHeader h_9;
  NOAALRITHeader h_8;
  SegmentIdentificationHeader h_7;
  AncillaryTextHeader h_6;
  size_t len;
  timespec ts;
  TimeStampHeader h_5;
  array<char,_128UL> tsbuf;
  AnnotationHeader h_4;
  string line;
  istringstream iss;
  string str;
  ImageDataFunctionHeader h_3;
  ImageNavigationHeader h_2;
  ImageStructureHeader h_1;
  uint64_t dataBytes;
  uint64_t dataBits;
  uint32_t headerBytes;
  uint32_t headerBits;
  string type;
  PrimaryHeader h;
  pair<const_int,_int> *it;
  const_iterator __end1;
  const_iterator __begin1;
  HeaderMap *__range1;
  File file;
  File *in_stack_fffffffffffff668;
  File *in_stack_fffffffffffff670;
  File *in_stack_fffffffffffff680;
  TimeStampHeader *in_stack_fffffffffffff6c0;
  string *in_stack_fffffffffffff9d8;
  File *in_stack_fffffffffffff9e0;
  string local_518 [38];
  RiceCompressionHeader local_4f2;
  allocator local_4e9;
  string local_4e8 [38];
  NOAALRITHeader local_4c2;
  ushort local_4ae;
  ushort local_4ac;
  ushort local_4aa;
  ushort local_4a8;
  ushort local_4a6;
  ushort local_4a4;
  ushort local_4a2;
  string local_498 [39];
  allocator local_471;
  string local_470 [32];
  size_t local_450;
  timespec local_448;
  TimeStampHeader local_438;
  TimeStampHeader local_428;
  array<char,_128UL> local_418;
  string local_390 [32];
  string local_370 [32];
  istream local_350;
  allocator local_1c9;
  string local_1c8 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0;
  string local_180 [32];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  ImageStructureHeader local_150;
  ImageStructureHeader local_140;
  ulong local_130;
  ulong local_128;
  uint local_120;
  uint local_11c;
  string local_118 [36];
  byte local_f4;
  uint local_f0;
  ulong local_e8;
  reference local_e0;
  _Self local_d8;
  _Self local_d0;
  HeaderMap *local_c8;
  File local_b0;
  string *local_18;
  long local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  lrit::File::File(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  poVar3 = std::operator<<((ostream *)&std::cout,local_18);
  poVar3 = std::operator<<(poVar3,":");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_c8 = lrit::File::getHeaderMap(&local_b0);
  local_d0._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  in_stack_fffffffffffff668);
  local_d8._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  in_stack_fffffffffffff668);
  do {
    bVar2 = std::operator!=(&local_d0,&local_d8);
    if (!bVar2) {
      local_4 = 0;
LAB_00168676:
      lrit::File::~File(in_stack_fffffffffffff670);
      return local_4;
    }
    local_e0 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*
                         ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)
                          in_stack_fffffffffffff670);
    if (local_e0->first == 0) {
      lrit::File::getHeader<lrit::PrimaryHeader>(in_stack_fffffffffffff670);
      poVar3 = std::operator<<((ostream *)&std::cout,"Primary (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::string(local_118);
      switch(local_f4) {
      case 0:
        std::__cxx11::string::operator=(local_118,"Image Data");
        break;
      case 1:
        std::__cxx11::string::operator=(local_118,"Service Message");
        break;
      case 2:
        std::__cxx11::string::operator=(local_118,"Alphanumeric Text");
        break;
      case 3:
        std::__cxx11::string::operator=(local_118,"Meteorological Data");
        break;
      case 4:
        std::__cxx11::string::operator=(local_118,"GTS Messages");
        break;
      default:
        std::__cxx11::string::operator=(local_118,"unknown");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"  File type: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_f4);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = std::operator<<(poVar3,local_118);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_11c = local_f0 << 3;
      local_120 = local_f0;
      poVar3 = std::operator<<((ostream *)&std::cout,"  Header header length (bits/bytes): ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_11c);
      poVar3 = std::operator<<(poVar3,"/");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_120);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      local_128 = local_e8;
      local_130 = local_e8 >> 3;
      poVar3 = std::operator<<((ostream *)&std::cout,"  Data length (bits/bytes): ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_128);
      poVar3 = std::operator<<(poVar3,"/");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_130);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Total length (bits/bytes): ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_11c + local_128);
      poVar3 = std::operator<<(poVar3,"/");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_120 + local_130);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_118);
    }
    else if (local_e0->first == 1) {
      IVar9 = lrit::File::getHeader<lrit::ImageStructureHeader>(in_stack_fffffffffffff680);
      local_150 = IVar9;
      local_140 = IVar9;
      poVar3 = std::operator<<((ostream *)&std::cout,"Image structure (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Bits per pixel: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_140.bitsPerPixel);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Columns: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_140.columns);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Lines: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_140.lines);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Compression: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_140._8_4_ >> 0x10 & 0xff);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    else if (local_e0->first == 2) {
      lrit::File::getHeader<lrit::ImageNavigationHeader>(in_stack_fffffffffffff668);
      poVar3 = std::operator<<((ostream *)&std::cout,"Image navigation (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Projection name: ");
      poVar3 = std::operator<<(poVar3,local_180);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Column scaling: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_160);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Line scaling: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_15c);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Column offset: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_158);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Line offset: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_154);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      lrit::ImageNavigationHeader::~ImageNavigationHeader((ImageNavigationHeader *)0x1674c7);
    }
    else if (local_e0->first == 3) {
      lrit::File::getHeader<lrit::ImageDataFunctionHeader>(in_stack_fffffffffffff668);
      poVar3 = std::operator<<((ostream *)&std::cout,"Image data function (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"  Data: ");
      if ((*(byte *)(local_10 + 2) & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"(omitted, length: ");
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_1a0);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1675c3);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_1a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,(char *)puVar5,sVar6,&local_1c9);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        std::__cxx11::istringstream::istringstream((istringstream *)&local_350,local_1c8,_S_in);
        std::__cxx11::string::string(local_370);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        while( true ) {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (&local_350,local_370,'\n');
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)((long)&piVar7->_vptr_basic_istream +
                                    (long)piVar7->_vptr_basic_istream[-3]));
          if (!bVar2) break;
          poVar3 = std::operator<<((ostream *)&std::cout,"    ");
          poVar3 = std::operator<<(poVar3,local_370);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        std::__cxx11::string::~string(local_370);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_350);
        std::__cxx11::string::~string(local_1c8);
      }
      lrit::ImageDataFunctionHeader::~ImageDataFunctionHeader((ImageDataFunctionHeader *)0x16785e);
    }
    else if (local_e0->first == 4) {
      lrit::File::getHeader<lrit::AnnotationHeader>(in_stack_fffffffffffff668);
      poVar3 = std::operator<<((ostream *)&std::cout,"Annotation (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Text: ");
      poVar3 = std::operator<<(poVar3,local_390);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      lrit::AnnotationHeader::~AnnotationHeader((AnnotationHeader *)0x167969);
    }
    else if (local_e0->first == 5) {
      TVar10 = lrit::File::getHeader<lrit::TimeStampHeader>(in_stack_fffffffffffff680);
      local_438 = TVar10;
      local_428 = TVar10;
      tVar11 = lrit::TimeStampHeader::getUnix(in_stack_fffffffffffff6c0);
      local_448 = tVar11;
      pvVar8 = std::array<char,_128UL>::data((array<char,_128UL> *)0x167a53);
      sVar6 = std::array<char,_128UL>::size(&local_418);
      __tp = gmtime(&local_448.tv_sec);
      local_450 = strftime(pvVar8,sVar6,"%Y-%m-%d %H:%M:%S",__tp);
      poVar3 = std::operator<<((ostream *)&std::cout,"Time stamp (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Time stamp: ");
      pvVar8 = std::array<char,_128UL>::data((array<char,_128UL> *)0x167b3b);
      sVar1 = local_450;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_470,pvVar8,sVar1,&local_471);
      poVar3 = std::operator<<(poVar3,local_470);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
    }
    else if (local_e0->first == 6) {
      lrit::File::getHeader<lrit::AncillaryTextHeader>(in_stack_fffffffffffff668);
      poVar3 = std::operator<<((ostream *)&std::cout,"Ancillary text (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Text: ");
      poVar3 = std::operator<<(poVar3,local_498);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      lrit::AncillaryTextHeader::~AncillaryTextHeader((AncillaryTextHeader *)0x167d20);
    }
    else if (local_e0->first == 0x80) {
      lrit::File::getHeader<lrit::SegmentIdentificationHeader>(in_stack_fffffffffffff670);
      poVar3 = std::operator<<((ostream *)&std::cout,"Segment identification (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x80);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Image identifier: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4ae);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Segment number: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4ac);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Start column of segment: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4aa);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Start line of segment: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4a8);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Number of segments: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4a6);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Width of final image: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4a4);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Height of final image: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4a2);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    else if (local_e0->first == 0x81) {
      NVar12 = lrit::File::getHeader<lrit::NOAALRITHeader>((File *)0x168047);
      local_4c2 = NVar12;
      poVar3 = std::operator<<((ostream *)&std::cout,"NOAA LRIT (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x81);
      poVar3 = std::operator<<(poVar3,"):");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Agency signature: ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e8,local_4c2.agencySignature,&local_4e9);
      poVar3 = std::operator<<(poVar3,local_4e8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Product ID: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4c2.productID);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Product SubID: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4c2.productSubID);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  Parameter: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4c2.parameter);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"  NOAA-specific compression: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_4c2.noaaSpecificCompression);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    else if (local_e0->first != 0x82) {
      if (local_e0->first == 0x83) {
        local_4f2 = lrit::File::getHeader<lrit::RiceCompressionHeader>(in_stack_fffffffffffff668);
        poVar3 = std::operator<<((ostream *)&std::cout,"Rice compression (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x83);
        poVar3 = std::operator<<(poVar3,"):");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"  Flags: ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4f2.flags);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"  Pixels per block: ");
        in_stack_fffffffffffff6c0 =
             (TimeStampHeader *)std::ostream::operator<<(poVar3,(uint)local_4f2.pixelsPerBlock);
        std::ostream::operator<<(in_stack_fffffffffffff6c0,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"  Scan lines per packet: ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_4f2.scanLinesPerPacket);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        if (local_e0->first != 0x84) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Header ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e0->first);
          in_stack_fffffffffffff670 = (File *)std::operator<<(poVar3," not handled...");
          std::ostream::operator<<(in_stack_fffffffffffff670,std::endl<char,std::char_traits<char>>)
          ;
          local_4 = 1;
          goto LAB_00168676;
        }
        lrit::File::getHeader<lrit::DCSFileNameHeader>(in_stack_fffffffffffff668);
        poVar3 = std::operator<<((ostream *)&std::cout,"DCS file name (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x84);
        poVar3 = std::operator<<(poVar3,"):");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"  File name: ");
        poVar3 = std::operator<<(poVar3,local_518);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        lrit::DCSFileNameHeader::~DCSFileNameHeader((DCSFileNameHeader *)0x168593);
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)in_stack_fffffffffffff670);
  } while( true );
}

Assistant:

int dump(const Options& opts, const std::string& name) {
  auto file = lrit::File(name);
  std::cout << name << ":" << std::endl;
  for (const auto& it : file.getHeaderMap()) {
    if (it.first == lrit::PrimaryHeader::CODE) {
      auto h = file.getHeader<lrit::PrimaryHeader>();
      std::cout << "Primary (" << decltype(h)::CODE << "):" << std::endl;

      std::string type;
      switch (h.fileType) {
      case 0:
        type = "Image Data";
        break;
      case 1:
        type = "Service Message";
        break;
      case 2:
        type = "Alphanumeric Text";
        break;
      case 3:
        type = "Meteorological Data";
        break;
      case 4:
        type = "GTS Messages";
        break;
      default:
        type = "unknown";
        break;
      }

      std::cout << "  File type: "
                << int(h.fileType)
                << " (" << type << ")"
                << std::endl;

      // LRIT value is in bytes
      auto headerBits = h.totalHeaderLength * 8;
      auto headerBytes = h.totalHeaderLength;
      std::cout << "  Header header length (bits/bytes): "
                << headerBits
                << "/"
                << headerBytes
                << std::endl;

      // LRIT value is in bits
      auto dataBits = h.dataLength;
      auto dataBytes = h.dataLength / 8;
      std::cout << "  Data length (bits/bytes): "
                << dataBits
                << "/"
                << dataBytes
                << std::endl;

      std::cout << "  Total length (bits/bytes): "
                << (headerBits + dataBits)
                << "/"
                << (headerBytes + dataBytes)
                << std::endl;
    } else if (it.first == lrit::ImageStructureHeader::CODE) {
      auto h = file.getHeader<lrit::ImageStructureHeader>();
      std::cout << "Image structure (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Bits per pixel: "
                << int(h.bitsPerPixel) << std::endl;
      std::cout << "  Columns: "
                << h.columns << std::endl;
      std::cout << "  Lines: "
                << h.lines << std::endl;
      std::cout << "  Compression: "
                << int(h.compression) << std::endl;
    } else if (it.first == lrit::ImageNavigationHeader::CODE) {
      auto h = file.getHeader<lrit::ImageNavigationHeader>();
      std::cout << "Image navigation (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Projection name: "
                << h.projectionName << std::endl;
      std::cout << "  Column scaling: "
                << h.columnScaling << std::endl;
      std::cout << "  Line scaling: "
                << h.lineScaling << std::endl;
      std::cout << "  Column offset: "
                << h.columnOffset << std::endl;
      std::cout << "  Line offset: "
                << h.lineOffset << std::endl;
    } else if (it.first == lrit::ImageDataFunctionHeader::CODE) {
      auto h = file.getHeader<lrit::ImageDataFunctionHeader>();
      std::cout << "Image data function (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Data: ";
      if (opts.verbose) {
        const auto str = std::string((const char*) h.data.data(), h.data.size());
        std::istringstream iss(str);
        std::string line;
        std::cout << std::endl;
        while (std::getline(iss, line, '\n')) {
          std::cout << "    " << line << std::endl;
        }
      } else {
        std::cout << "(omitted, length: " << h.data.size() << ")" << std::endl;
      }
    } else if (it.first == lrit::AnnotationHeader::CODE) {
      auto h = file.getHeader<lrit::AnnotationHeader>();
      std::cout << "Annotation (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Text: "
                << h.text << std::endl;
    } else if (it.first == lrit::TimeStampHeader::CODE) {
      std::array<char, 128> tsbuf;
      auto h = file.getHeader<lrit::TimeStampHeader>();
      auto ts = h.getUnix();
      auto len = strftime(
        tsbuf.data(),
        tsbuf.size(),
        "%Y-%m-%d %H:%M:%S",
        gmtime(&ts.tv_sec));
      std::cout << "Time stamp (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Time stamp: "
                << std::string(tsbuf.data(), len) << std::endl;
    } else if (it.first == lrit::AncillaryTextHeader::CODE) {
      auto h = file.getHeader<lrit::AncillaryTextHeader>();
      std::cout << "Ancillary text (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Text: "
                << h.text << std::endl;
    } else if (it.first == lrit::SegmentIdentificationHeader::CODE) {
      auto h = file.getHeader<lrit::SegmentIdentificationHeader>();
      std::cout << "Segment identification (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Image identifier: "
                << h.imageIdentifier << std::endl;
      std::cout << "  Segment number: "
                << h.segmentNumber << std::endl;
      std::cout << "  Start column of segment: "
                << h.segmentStartColumn << std::endl;
      std::cout << "  Start line of segment: "
                << h.segmentStartLine << std::endl;
      std::cout << "  Number of segments: "
                << h.maxSegment << std::endl;
      std::cout << "  Width of final image: "
                << h.maxColumn << std::endl;
      std::cout << "  Height of final image: "
                << h.maxLine << std::endl;
    } else if (it.first == lrit::NOAALRITHeader::CODE) {
      auto h = file.getHeader<lrit::NOAALRITHeader>();
      std::cout << "NOAA LRIT (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Agency signature: "
                << std::string(h.agencySignature) << std::endl;
      std::cout << "  Product ID: "
                << h.productID << std::endl;
      std::cout << "  Product SubID: "
                << h.productSubID << std::endl;
      std::cout << "  Parameter: "
                << h.parameter << std::endl;
      std::cout << "  NOAA-specific compression: "
                << int(h.noaaSpecificCompression) << std::endl;
    } else if (it.first == lrit::HeaderStructureRecordHeader::CODE) {
      // Ignore...
    } else if (it.first == lrit::RiceCompressionHeader::CODE) {
      auto h = file.getHeader<lrit::RiceCompressionHeader>();
      std::cout << "Rice compression (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Flags: "
                << h.flags << std::endl;
      std::cout << "  Pixels per block: "
                << int(h.pixelsPerBlock) << std::endl;
      std::cout << "  Scan lines per packet: "
                << int(h.scanLinesPerPacket) << std::endl;
    } else if (it.first == lrit::DCSFileNameHeader::CODE) {
      auto h = file.getHeader<lrit::DCSFileNameHeader>();
      std::cout << "DCS file name (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  File name: " << h.fileName << std::endl;

    } else {
      std::cerr << "Header " << it.first << " not handled..." << std::endl;
      return 1;
    }
  }
  return 0;
}